

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void ml_prune_ab_partition
               (AV1_COMP *cpi,int part_ctx,int var_ctx,int64_t best_rd,
               PartitionSearchState *part_state,int *ab_partitions_allowed)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  undefined4 *in_R9;
  float id;
  float feature_size;
  int i_5;
  int thresh;
  int i_4;
  int max_score;
  int int_score [16];
  float score [16];
  float rd_ratio;
  int i_3;
  int64_t *split_rd;
  int i_2;
  int64_t *vert_rd;
  int i_1;
  int64_t *horz_rd;
  int i;
  int rd_index;
  int sub_block_rdcost [8];
  int rdcost;
  int feature_index;
  float features [10];
  NN_CONFIG *nn_config;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams blk_params;
  int *in_stack_00002980;
  int *in_stack_00002988;
  int *in_stack_00002990;
  float *in_stack_00002998;
  int in_stack_000029a4;
  ExtPartController *in_stack_000029a8;
  int *in_stack_000029c0;
  int local_1b4;
  int local_1a8;
  uint local_198;
  int local_194;
  int local_190;
  int local_18c;
  int aiStack_188 [16];
  float local_148 [18];
  float local_100;
  int local_fc;
  long local_f8;
  int local_ec;
  long local_e8;
  int local_dc;
  long local_d8;
  int local_d0;
  int local_cc;
  int local_c8 [10];
  int local_a0;
  float *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  NN_CONFIG *pNVar4;
  undefined1 local_54 [40];
  byte local_2c;
  undefined4 *local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memcpy(local_54,(void *)(in_R8 + 8),0x2c);
  if ((2 < local_2c) && (local_18 < 1000000000)) {
    pNVar4 = (NN_CONFIG *)0x0;
    switch(local_2c) {
    case 3:
      pNVar4 = (NN_CONFIG *)0x0;
      break;
    default:
      break;
    case 6:
      pNVar4 = &av1_ab_partition_nnconfig_16;
      break;
    case 9:
      pNVar4 = &av1_ab_partition_nnconfig_32;
      break;
    case 0xc:
      pNVar4 = &av1_ab_partition_nnconfig_64;
      break;
    case 0xf:
      pNVar4 = &av1_ab_partition_nnconfig_128;
    }
    if (pNVar4 != (NN_CONFIG *)0x0) {
      id = (float)local_c;
      feature_size = (float)local_10;
      iVar3 = 2;
      if (local_18 < 0x80000000) {
        local_1a8 = (int)local_18;
      }
      else {
        local_1a8 = 0x7fffffff;
      }
      local_a0 = local_1a8;
      memset(local_c8,0,0x20);
      local_cc = 0;
      for (local_d0 = 0; local_d0 < 2; local_d0 = local_d0 + 1) {
        local_d8 = local_20 + 0xe8;
        if ((0 < *(long *)(local_d8 + (long)local_d0 * 8)) &&
           (*(long *)(local_d8 + (long)local_d0 * 8) < 1000000000)) {
          local_c8[local_cc] = (int)*(undefined8 *)(local_d8 + (long)local_d0 * 8);
        }
        local_cc = local_cc + 1;
      }
      for (local_dc = 0; local_dc < 2; local_dc = local_dc + 1) {
        local_e8 = local_20 + 0xf8;
        if ((0 < *(long *)(local_e8 + (long)local_dc * 8)) &&
           (*(long *)(local_e8 + (long)local_dc * 8) < 1000000000)) {
          local_c8[local_cc] = (int)*(undefined8 *)(local_e8 + (long)local_dc * 8);
        }
        local_cc = local_cc + 1;
      }
      for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
        local_f8 = local_20 + 200;
        if ((0 < *(long *)(local_f8 + (long)local_ec * 8)) &&
           (*(long *)(local_f8 + (long)local_ec * 8) < 1000000000)) {
          local_c8[local_cc] = (int)*(undefined8 *)(local_f8 + (long)local_ec * 8);
        }
        local_cc = local_cc + 1;
      }
      for (local_fc = 0; local_fc < 8; local_fc = local_fc + 1) {
        local_100 = 1.0;
        if ((0 < local_c8[local_fc]) && (local_c8[local_fc] < local_a0)) {
          local_100 = (float)local_c8[local_fc] / (float)local_a0;
        }
        *(float *)(&stack0xffffffffffffff68 + (long)iVar3 * 4) = local_100;
        iVar3 = iVar3 + 1;
      }
      iVar2 = frame_is_intra_only((AV1_COMMON *)(local_8 + 0x3bf80));
      if (iVar2 == 0) {
        write_features_to_file
                  (in_stack_ffffffffffffff80,(_Bool)in_stack_ffffffffffffff7f,
                   in_stack_ffffffffffffff70,(int)feature_size,(int)id,
                   (BLOCK_SIZE)((uint)iVar3 >> 0x18),in_stack_ffffffffffffff90,(int)pNVar4);
      }
      frame_is_intra_only((AV1_COMMON *)(local_8 + 0x3bf80));
      _Var1 = ext_ml_model_decision_after_rect
                        (in_stack_000029a8,in_stack_000029a4,in_stack_00002998,in_stack_00002990,
                         in_stack_00002988,in_stack_00002980,in_stack_000029c0);
      if (!_Var1) {
        memset(local_148,0,0x40);
        (*av1_nn_predict)((float *)&stack0xffffffffffffff68,pNVar4,1,local_148);
        local_18c = -1000;
        for (local_190 = 0; local_190 < 0x10; local_190 = local_190 + 1) {
          aiStack_188[local_190] = (int)(local_148[local_190] * 100.0);
          if (local_18c < aiStack_188[local_190]) {
            local_1b4 = aiStack_188[local_190];
          }
          else {
            local_1b4 = local_18c;
          }
          local_18c = local_1b4;
        }
        local_194 = local_18c;
        if (local_2c == 6) {
          local_194 = local_18c + -0x96;
        }
        else if (local_2c == 9) {
          local_194 = local_18c + -100;
        }
        memset(local_28,0,0x10);
        for (local_198 = 0; (int)local_198 < 0x10; local_198 = local_198 + 1) {
          if (local_194 <= aiStack_188[(int)local_198]) {
            if ((local_198 & 1) != 0) {
              *local_28 = 1;
            }
            if (((int)local_198 >> 1 & 1U) != 0) {
              local_28[1] = 1;
            }
            if (((int)local_198 >> 2 & 1U) != 0) {
              local_28[2] = 1;
            }
            if (((int)local_198 >> 3 & 1U) != 0) {
              local_28[3] = 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ml_prune_ab_partition(AV1_COMP *const cpi, int part_ctx,
                                  int var_ctx, int64_t best_rd,
                                  PartitionSearchState *part_state,
                                  int *ab_partitions_allowed) {
  const PartitionBlkParams blk_params = part_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;

  if (bsize < BLOCK_8X8 || best_rd >= 1000000000) return;
  const NN_CONFIG *nn_config = NULL;
  switch (bsize) {
    case BLOCK_8X8: nn_config = NULL; break;
    case BLOCK_16X16: nn_config = &av1_ab_partition_nnconfig_16; break;
    case BLOCK_32X32: nn_config = &av1_ab_partition_nnconfig_32; break;
    case BLOCK_64X64: nn_config = &av1_ab_partition_nnconfig_64; break;
    case BLOCK_128X128: nn_config = &av1_ab_partition_nnconfig_128; break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // Generate features.
  float features[10];
  int feature_index = 0;
  features[feature_index++] = (float)part_ctx;
  features[feature_index++] = (float)var_ctx;
  const int rdcost = (int)AOMMIN(INT_MAX, best_rd);
  int sub_block_rdcost[8] = { 0 };
  int rd_index = 0;
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    const int64_t *horz_rd = part_state->rect_part_rd[HORZ];
    if (horz_rd[i] > 0 && horz_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)horz_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    const int64_t *vert_rd = part_state->rect_part_rd[VERT];
    if (vert_rd[i] > 0 && vert_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)vert_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    const int64_t *split_rd = part_state->split_rd;
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)split_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < 8; ++i) {
    // Ratio between the sub-block RD and the whole-block RD.
    float rd_ratio = 1.0f;
    if (sub_block_rdcost[i] > 0 && sub_block_rdcost[i] < rdcost)
      rd_ratio = (float)sub_block_rdcost[i] / (float)rdcost;
    features[feature_index++] = rd_ratio;
  }
  assert(feature_index == 10);

  // Write features to file
  if (!frame_is_intra_only(&cpi->common)) {
    write_features_to_file(cpi->oxcf.partition_info_path,
                           cpi->ext_part_controller.test_mode, features,
                           /*feature_size=*/10, 6, bsize, mi_row, mi_col);
  }

  if (ext_ml_model_decision_after_rect(
          &cpi->ext_part_controller, frame_is_intra_only(&cpi->common),
          features, &ab_partitions_allowed[HORZ_A],
          &ab_partitions_allowed[HORZ_B], &ab_partitions_allowed[VERT_A],
          &ab_partitions_allowed[VERT_B])) {
    return;
  }

  // Calculate scores using the NN model.
  float score[16] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, score);
  int int_score[16];
  int max_score = -1000;
  for (int i = 0; i < 16; ++i) {
    int_score[i] = (int)(100 * score[i]);
    max_score = AOMMAX(int_score[i], max_score);
  }

  // Make decisions based on the model scores.
  int thresh = max_score;
  switch (bsize) {
    case BLOCK_16X16: thresh -= 150; break;
    case BLOCK_32X32: thresh -= 100; break;
    default: break;
  }
  av1_zero_array(ab_partitions_allowed, NUM_AB_PARTS);
  for (int i = 0; i < 16; ++i) {
    if (int_score[i] >= thresh) {
      if ((i >> 0) & 1) ab_partitions_allowed[HORZ_A] = 1;
      if ((i >> 1) & 1) ab_partitions_allowed[HORZ_B] = 1;
      if ((i >> 2) & 1) ab_partitions_allowed[VERT_A] = 1;
      if ((i >> 3) & 1) ab_partitions_allowed[VERT_B] = 1;
    }
  }
}